

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

int __thiscall cmCTest::GenerateDoneFile(cmCTest *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var2;
  bool bVar3;
  int iVar4;
  cmXMLWriter xml;
  cmGeneratedFileStream ofs;
  string local_428;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_408;
  undefined1 local_400 [112];
  ios_base local_390 [264];
  cmGeneratedFileStream local_288;
  
  cmGeneratedFileStream::cmGeneratedFileStream(&local_288,None);
  _Var2._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  local_400._0_8_ = local_400 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_400,"Done.xml","");
  bVar3 = OpenOutputFile(this,&(_Var2._M_head_impl)->CurrentTag,(string *)local_400,&local_288,false
                        );
  if ((undefined1 *)local_400._0_8_ != local_400 + 0x10) {
    operator_delete((void *)local_400._0_8_,local_400._16_8_ + 1);
  }
  if (bVar3) {
    cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_400,(ostream *)&local_288,0);
    cmXMLWriter::StartDocument((cmXMLWriter *)local_400,"UTF-8");
    paVar1 = &local_428.field_2;
    local_428._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"Done","");
    cmXMLWriter::StartElement((cmXMLWriter *)local_400,&local_428);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p != paVar1) {
      operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
    }
    local_428._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"buildId","");
    _Var2._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    cmXMLWriter::StartElement((cmXMLWriter *)local_400,&local_428);
    cmXMLWriter::Content<std::__cxx11::string>
              ((cmXMLWriter *)local_400,&(_Var2._M_head_impl)->BuildID);
    cmXMLWriter::EndElement((cmXMLWriter *)local_400);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p != paVar1) {
      operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
    }
    local_428._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"time","");
    local_408.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    cmXMLWriter::
    Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
              ((cmXMLWriter *)local_400,&local_428,&local_408);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p != paVar1) {
      operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
    }
    cmXMLWriter::EndElement((cmXMLWriter *)local_400);
    cmXMLWriter::EndDocument((cmXMLWriter *)local_400);
    cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_400);
    iVar4 = 0;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_400);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_400,"Cannot open done file",0x15);
    std::ios::widen((char)*(undefined8 *)(local_400._0_8_ + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,7,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCTest.cxx"
        ,0x651,local_428._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p != &local_428.field_2) {
      operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_400);
    std::ios_base::~ios_base(local_390);
    iVar4 = 1;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&local_288);
  return iVar4;
}

Assistant:

int cmCTest::GenerateDoneFile()
{
  cmGeneratedFileStream ofs;
  if (!this->OpenOutputFile(this->Impl->CurrentTag, "Done.xml", ofs)) {
    cmCTestLog(this, ERROR_MESSAGE, "Cannot open done file" << std::endl);
    return 1;
  }
  cmXMLWriter xml(ofs);
  xml.StartDocument();
  xml.StartElement("Done");
  xml.Element("buildId", this->Impl->BuildID);
  xml.Element("time", std::chrono::system_clock::now());
  xml.EndElement(); // Done
  xml.EndDocument();

  return 0;
}